

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::Action<pstore::serialize::archive::void_type_(const_int_&)>::Action
          (Action<pstore::serialize::archive::void_type_(const_int_&)> *this,
          ActionInterface<pstore::serialize::archive::void_type_(const_int_&)> *impl)

{
  ActionAdapter local_28;
  ActionInterface<pstore::serialize::archive::void_type_(const_int_&)> *local_18;
  ActionInterface<pstore::serialize::archive::void_type_(const_int_&)> *impl_local;
  Action<pstore::serialize::archive::void_type_(const_int_&)> *this_local;
  
  local_18 = impl;
  impl_local = (ActionInterface<pstore::serialize::archive::void_type_(const_int_&)> *)this;
  std::shared_ptr<testing::ActionInterface<pstore::serialize::archive::void_type(int_const&)>>::
  shared_ptr<testing::ActionInterface<pstore::serialize::archive::void_type(int_const&)>,void>
            ((shared_ptr<testing::ActionInterface<pstore::serialize::archive::void_type(int_const&)>>
              *)&local_28,impl);
  std::function<pstore::serialize::archive::void_type(int_const&)>::
  function<testing::Action<pstore::serialize::archive::void_type(int_const&)>::ActionAdapter,void>
            ((function<pstore::serialize::archive::void_type(int_const&)> *)this,&local_28);
  ActionAdapter::~ActionAdapter(&local_28);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}